

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_server.c
# Opt level: O0

void write_complete(cio_websocket *websocket,void *handler_context,cio_error err)

{
  cio_error local_1c;
  cio_error err_local;
  void *handler_context_local;
  cio_websocket *websocket_local;
  
  if (err == CIO_SUCCESS) {
    local_1c = cio_websocket_close(websocket,CIO_WEBSOCKET_CLOSE_NORMAL,
                                   write_complete::close_message,(cio_websocket_write_handler_t)0x0,
                                   (void *)0x0);
  }
  else {
    local_1c = cio_websocket_close(websocket,CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR,
                                   "write did not complete",(cio_websocket_write_handler_t)0x0,
                                   (void *)0x0);
  }
  if (local_1c != CIO_SUCCESS) {
    fprintf(_stderr,"Could not start writing websocket close!\n");
  }
  return;
}

Assistant:

static void write_complete(struct cio_websocket *websocket, void *handler_context, enum cio_error err)
{
	(void)handler_context;

	if (err == CIO_SUCCESS) {
		static const char *close_message = "Good Bye!";
		err = cio_websocket_close(websocket, CIO_WEBSOCKET_CLOSE_NORMAL, close_message, NULL, NULL);
	} else {
		err = cio_websocket_close(websocket, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "write did not complete", NULL, NULL);
	}

	if (err != CIO_SUCCESS) {
		(void)fprintf(stderr, "Could not start writing websocket close!\n");
	}
}